

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O1

void __thiscall Text::Text(Text *this)

{
  initializer_list<unsigned_int> __l;
  allocator_type local_1d;
  uint local_1c;
  
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  (this->content)._M_string_length = 0;
  (this->content).field_2._M_local_buf[0] = L'\0';
  local_1c = 0;
  __l._M_len = 1;
  __l._M_array = &local_1c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->line_offsets,__l,&local_1d);
  return;
}

Assistant:

Text::Text() : line_offsets{0} {}